

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::detail::generic_type::def_property_static_impl
          (generic_type *this,char *name,handle fget,handle fset,function_record *rec_fget)

{
  PyObject *pPVar1;
  internals *piVar2;
  PyObject **ppPVar3;
  char *local_e8;
  PyTypeObject *local_d8;
  bool local_c9;
  bool local_b9;
  str_attr_accessor local_b8;
  str local_98;
  none local_90;
  byte local_81;
  handle local_80 [3];
  handle local_68;
  byte local_59;
  object local_58;
  handle local_50;
  object local_48;
  handle local_40;
  handle property;
  bool has_doc;
  bool is_static;
  function_record *rec_fget_local;
  char *name_local;
  generic_type *this_local;
  handle fset_local;
  handle fget_local;
  
  local_b9 = false;
  this_local = (generic_type *)fset.m_ptr;
  fset_local.m_ptr = fget.m_ptr;
  if (((byte)rec_fget->field_0x59 >> 5 & 1) != 0) {
    local_b9 = handle::operator_cast_to_bool(&rec_fget->scope);
  }
  property.m_ptr._7_1_ = (local_b9 ^ 0xffU) & 1;
  local_c9 = false;
  if (rec_fget->doc != (char *)0x0) {
    local_c9 = options::show_user_defined_docstrings();
  }
  property.m_ptr._6_1_ = local_c9;
  if ((property.m_ptr._7_1_ & 1) == 0) {
    local_d8 = (PyTypeObject *)&PyProperty_Type;
  }
  else {
    piVar2 = get_internals();
    local_d8 = piVar2->static_property_type;
  }
  handle::handle(&local_40,(PyObject *)local_d8);
  ppPVar3 = handle::ptr(&fset_local);
  pPVar1 = *ppPVar3;
  local_59 = 0;
  if (pPVar1 == (PyObject *)0x0) {
    none::none((none *)&local_58);
    local_50 = local_58.super_handle.m_ptr;
  }
  else {
    local_50.m_ptr = fset_local.m_ptr;
  }
  local_81 = 0;
  local_59 = pPVar1 == (PyObject *)0x0;
  ppPVar3 = handle::ptr((handle *)&this_local);
  if (*ppPVar3 == (PyObject *)0x0) {
    none::none((none *)local_80);
    local_81 = 1;
    local_68.m_ptr = local_80[0].m_ptr;
  }
  else {
    local_68.m_ptr = (PyObject *)this_local;
  }
  none::none(&local_90);
  if ((property.m_ptr._6_1_ & 1) == 0) {
    local_e8 = "";
  }
  else {
    local_e8 = rec_fget->doc;
  }
  str::str(&local_98,local_e8);
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_48,&local_40,&local_50,(none *)&local_68,
             (str *)&local_90);
  object_api<pybind11::handle>::attr(&local_b8,(object_api<pybind11::handle> *)this,name);
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_b8,&local_48);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_b8);
  object::~object(&local_48);
  str::~str(&local_98);
  none::~none(&local_90);
  if ((local_81 & 1) != 0) {
    none::~none((none *)local_80);
  }
  if ((local_59 & 1) != 0) {
    none::~none((none *)&local_58);
  }
  return;
}

Assistant:

void def_property_static_impl(const char *name,
                                  handle fget, handle fset,
                                  detail::function_record *rec_fget) {
        const auto is_static = !(rec_fget->is_method && rec_fget->scope);
        const auto has_doc = rec_fget->doc && pybind11::options::show_user_defined_docstrings();

        auto property = handle((PyObject *) (is_static ? get_internals().static_property_type
                                                       : &PyProperty_Type));
        attr(name) = property(fget.ptr() ? fget : none(),
                              fset.ptr() ? fset : none(),
                              /*deleter*/none(),
                              pybind11::str(has_doc ? rec_fget->doc : ""));
    }